

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O3

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,Constant *c)

{
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *end;
  Context *context;
  Allocator *pAVar1;
  undefined4 uVar2;
  byte bVar3;
  Expression *pEVar4;
  CommaSeparatedList *args_1;
  CommaSeparatedList *pCVar5;
  Constant *pCVar6;
  CallOrCast *pCVar7;
  ulong uVar8;
  double start;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *start_00;
  ArraySize AVar9;
  size_t sVar10;
  Value *in_R8;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float v;
  undefined4 extraout_XMM0_Da_01;
  float v_00;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float v_01;
  undefined4 extraout_XMM0_Db_01;
  float v_02;
  undefined4 extraout_XMM0_Db_02;
  double in_XMM1_Qa;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> elements_01;
  ArrayView<soul::Value> elements_02;
  Type resultType;
  ArrayWithPreallocation<soul::Value,_8UL> realValues;
  ArrayWithPreallocation<soul::Value,_8UL> imagValues;
  byte local_570 [8];
  int local_568;
  Structure *local_560;
  Value *local_558;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *local_550;
  double local_548;
  PrimitiveType local_540;
  PrimitiveType local_53c;
  undefined8 local_538;
  Value local_528;
  Expression *local_4e8;
  PrimitiveType local_4e0;
  PrimitiveType local_4dc;
  undefined1 local_4d8 [24];
  undefined1 local_4c0 [24];
  undefined1 local_4a8 [24];
  undefined1 local_490 [24];
  undefined1 local_478 [8];
  uint64_t local_470 [1];
  StructurePtr local_468;
  Value local_460 [8];
  PackedData local_260;
  undefined1 local_248 [536];
  
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_478);
  uVar2 = local_478._4_4_;
  RefCountedPtr<soul::Structure>::decIfNotNull(local_468.object);
  if (1 < uVar2 - complex32) {
    return &c->super_Expression;
  }
  context = &(c->super_Expression).super_Statement.super_ASTObject.context;
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])((Type *)local_478,c);
  pEVar4 = getRemappedType(this,context,(Type *)local_478);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_468.object);
  args_1 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                     (&this->allocator->pool,context);
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_570,c);
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_478,c);
  uVar2 = local_478._4_4_;
  local_4e8 = pEVar4;
  RefCountedPtr<soul::Structure>::decIfNotNull(local_468.object);
  if (uVar2 == complex32) {
    if (local_570[0] == 2) {
      local_478 = (undefined1  [8])local_460;
      local_470[0] = 0;
      local_468.object = (Structure *)0x8;
      local_248._0_8_ = local_248 + 0x18;
      local_248._8_8_ = (uint8_t *)0x0;
      local_248._16_8_ = 8;
      sVar10 = 1;
      bVar3 = 2;
      while( true ) {
        uVar8 = (ulong)bVar3;
        if (bVar3 != 1) {
          if (bVar3 != 2) {
            throwInternalCompilerError("isVector()","getVectorSize",0xf7);
          }
          uVar8 = (ulong)local_568;
        }
        if (uVar8 <= sVar10 - 1) break;
        soul::Value::getSlice(&local_528,&c->value,sVar10 - 1,sVar10);
        soul::Value::getData(&local_260,&local_528);
        soul::Value::PackedData::getAsComplex32(&local_260);
        soul::Value::~Value(&local_528);
        soul::Value::Value(&local_528,v);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_478,&local_528);
        soul::Value::~Value(&local_528);
        soul::Value::Value(&local_528,v_01);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248,&local_528);
        soul::Value::~Value(&local_528);
        sVar10 = sVar10 + 1;
        bVar3 = local_570[0];
      }
      pAVar1 = this->allocator;
      local_4dc.type = float32;
      AVar9 = 1;
      if (bVar3 != 1) {
        AVar9 = (long)local_568;
      }
      Type::createVector((Type *)local_490,&local_4dc,AVar9);
      elements.s = (Value *)((long)local_478 + local_470[0] * 0x40);
      elements.e = in_R8;
      soul::Value::createArrayOrVector(&local_528,(Value *)local_490,(Type *)local_478,elements);
      pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,&local_528);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (&args_1->items,(args_1->items).numActive + 1);
      sVar10 = (args_1->items).numActive;
      (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
      (args_1->items).numActive = sVar10 + 1;
      soul::Value::~Value(&local_528);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_490._16_8_);
      pAVar1 = this->allocator;
      local_53c.type = float32;
      AVar9 = (ArraySize)local_570[0];
      if (local_570[0] != 1) {
        if (local_570[0] != 2) {
          throwInternalCompilerError("isVector()","getVectorSize",0xf7);
        }
        AVar9 = (ArraySize)local_568;
      }
      Type::createVector((Type *)local_4a8,&local_53c,AVar9);
      elements_00.s = (Value *)(local_248._0_8_ + local_248._8_8_ * 0x40);
      elements_00.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_528,(Value *)local_4a8,(Type *)local_248._0_8_,elements_00);
      pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,&local_528);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (&args_1->items,(args_1->items).numActive + 1);
      sVar10 = (args_1->items).numActive;
      (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
      (args_1->items).numActive = sVar10 + 1;
      soul::Value::~Value(&local_528);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_4a8._16_8_);
LAB_00228862:
      ArrayWithPreallocation<soul::Value,_8UL>::clear
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248);
      ArrayWithPreallocation<soul::Value,_8UL>::clear
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_478);
      goto LAB_0022887c;
    }
    if (local_570[0] == 3) {
      local_550 = &args_1->items;
      start = 0.0;
      local_558 = &c->value;
      while ((ulong)start < (ulong)(long)local_568) {
        local_548 = (double)((long)start + 1);
        soul::Value::getSlice((Value *)local_478,local_558,(size_t)start,(size_t)local_548);
        soul::Value::getData((PackedData *)local_248,(Value *)local_478);
        soul::Value::PackedData::getAsComplex32((PackedData *)local_248);
        local_538._0_4_ = extraout_XMM0_Da;
        local_538._4_4_ = extraout_XMM0_Db;
        soul::Value::~Value((Value *)local_478);
        pCVar5 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (&this->allocator->pool,context);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)local_478,(float)local_538);
        pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (&pAVar1->pool,context,(Value *)local_478);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  (&pCVar5->items,(pCVar5->items).numActive + 1);
        sVar10 = (pCVar5->items).numActive;
        (pCVar5->items).items[sVar10].object = &pCVar6->super_Expression;
        (pCVar5->items).numActive = sVar10 + 1;
        soul::Value::~Value((Value *)local_478);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)local_478,local_538._4_4_);
        pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (&pAVar1->pool,context,(Value *)local_478);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  (&pCVar5->items,(pCVar5->items).numActive + 1);
        sVar10 = (pCVar5->items).numActive;
        (pCVar5->items).items[sVar10].object = &pCVar6->super_Expression;
        (pCVar5->items).numActive = sVar10 + 1;
        soul::Value::~Value((Value *)local_478);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  (local_550,(args_1->items).numActive + 1);
        sVar10 = (args_1->items).numActive;
        (args_1->items).items[sVar10].object = &pCVar5->super_Expression;
        (args_1->items).numActive = sVar10 + 1;
        start = local_548;
        if (local_570[0] != 3) {
          throwInternalCompilerError("isArray()","getArraySize",0x128);
        }
      }
      goto LAB_0022887c;
    }
    soul::Value::getData((PackedData *)local_478,&c->value);
    soul::Value::PackedData::getAsComplex32((PackedData *)local_478);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)local_478,v_00);
    pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,(Value *)local_478);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              (&args_1->items,(args_1->items).numActive + 1);
    sVar10 = (args_1->items).numActive;
    (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
    (args_1->items).numActive = sVar10 + 1;
    soul::Value::~Value((Value *)local_478);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)local_478,v_02);
    pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,(Value *)local_478);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              (&args_1->items,(args_1->items).numActive + 1);
  }
  else {
    if (local_570[0] == 2) {
      local_478 = (undefined1  [8])local_460;
      local_470[0] = 0;
      local_468.object = (Structure *)0x8;
      local_248._0_8_ = local_248 + 0x18;
      local_248._8_8_ = (uint8_t *)0x0;
      local_248._16_8_ = 8;
      sVar10 = 1;
      bVar3 = 2;
      while( true ) {
        uVar8 = (ulong)bVar3;
        if (bVar3 != 1) {
          if (bVar3 != 2) {
            throwInternalCompilerError("isVector()","getVectorSize",0xf7);
          }
          uVar8 = (ulong)local_568;
        }
        if (uVar8 <= sVar10 - 1) break;
        soul::Value::getSlice(&local_528,&c->value,sVar10 - 1,sVar10);
        soul::Value::getData(&local_260,&local_528);
        soul::Value::PackedData::getAsComplex64(&local_260);
        local_538 = in_XMM1_Qa;
        soul::Value::~Value(&local_528);
        soul::Value::Value(&local_528,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_478,&local_528);
        soul::Value::~Value(&local_528);
        soul::Value::Value(&local_528,local_538);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248,&local_528);
        soul::Value::~Value(&local_528);
        sVar10 = sVar10 + 1;
        bVar3 = local_570[0];
      }
      pAVar1 = this->allocator;
      local_4e0.type = float64;
      AVar9 = 1;
      if (bVar3 != 1) {
        AVar9 = (long)local_568;
      }
      Type::createVector((Type *)local_4c0,&local_4e0,AVar9);
      elements_01.s = (Value *)((long)local_478 + local_470[0] * 0x40);
      elements_01.e = in_R8;
      soul::Value::createArrayOrVector(&local_528,(Value *)local_4c0,(Type *)local_478,elements_01);
      pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,&local_528);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (&args_1->items,(args_1->items).numActive + 1);
      sVar10 = (args_1->items).numActive;
      (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
      (args_1->items).numActive = sVar10 + 1;
      soul::Value::~Value(&local_528);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_4c0._16_8_);
      pAVar1 = this->allocator;
      local_540.type = float64;
      AVar9 = (ArraySize)local_570[0];
      if (local_570[0] != 1) {
        if (local_570[0] != 2) {
          throwInternalCompilerError("isVector()","getVectorSize",0xf7);
        }
        AVar9 = (ArraySize)local_568;
      }
      Type::createVector((Type *)local_4d8,&local_540,AVar9);
      elements_02.s = (Value *)(local_248._0_8_ + local_248._8_8_ * 0x40);
      elements_02.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_528,(Value *)local_4d8,(Type *)local_248._0_8_,elements_02);
      pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,&local_528);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (&args_1->items,(args_1->items).numActive + 1);
      sVar10 = (args_1->items).numActive;
      (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
      (args_1->items).numActive = sVar10 + 1;
      soul::Value::~Value(&local_528);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_4d8._16_8_);
      goto LAB_00228862;
    }
    if (local_570[0] == 3) {
      local_558 = (Value *)&args_1->items;
      start_00 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)0x0;
      while (start_00 <
             (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(long)local_568)
      {
        end = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
              ((long)&start_00->items + 1);
        soul::Value::getSlice((Value *)local_478,&c->value,(size_t)start_00,(size_t)end);
        local_550 = end;
        soul::Value::getData((PackedData *)local_248,(Value *)local_478);
        soul::Value::PackedData::getAsComplex64((PackedData *)local_248);
        local_538 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        local_548 = in_XMM1_Qa;
        soul::Value::~Value((Value *)local_478);
        pCVar5 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (&this->allocator->pool,context);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)local_478,local_538);
        pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (&pAVar1->pool,context,(Value *)local_478);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  (&pCVar5->items,(pCVar5->items).numActive + 1);
        sVar10 = (pCVar5->items).numActive;
        (pCVar5->items).items[sVar10].object = &pCVar6->super_Expression;
        (pCVar5->items).numActive = sVar10 + 1;
        soul::Value::~Value((Value *)local_478);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)local_478,local_548);
        pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (&pAVar1->pool,context,(Value *)local_478);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  (&pCVar5->items,(pCVar5->items).numActive + 1);
        sVar10 = (pCVar5->items).numActive;
        (pCVar5->items).items[sVar10].object = &pCVar6->super_Expression;
        (pCVar5->items).numActive = sVar10 + 1;
        soul::Value::~Value((Value *)local_478);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_558,
                   (args_1->items).numActive + 1);
        sVar10 = (args_1->items).numActive;
        (args_1->items).items[sVar10].object = &pCVar5->super_Expression;
        (args_1->items).numActive = sVar10 + 1;
        start_00 = local_550;
        if (local_570[0] != 3) {
          throwInternalCompilerError("isArray()","getArraySize",0x128);
        }
      }
      goto LAB_0022887c;
    }
    soul::Value::getData((PackedData *)local_478,&c->value);
    soul::Value::PackedData::getAsComplex64((PackedData *)local_478);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)local_478,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02))
    ;
    pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,(Value *)local_478);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              (&args_1->items,(args_1->items).numActive + 1);
    sVar10 = (args_1->items).numActive;
    (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
    (args_1->items).numActive = sVar10 + 1;
    soul::Value::~Value((Value *)local_478);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)local_478,in_XMM1_Qa);
    pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,(Value *)local_478);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              (&args_1->items,(args_1->items).numActive + 1);
  }
  sVar10 = (args_1->items).numActive;
  (args_1->items).items[sVar10].object = &pCVar6->super_Expression;
  (args_1->items).numActive = sVar10 + 1;
  soul::Value::~Value((Value *)local_478);
LAB_0022887c:
  local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
  pCVar7 = PoolAllocator::
           allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::AST::CommaSeparatedList&,bool>
                     (&this->allocator->pool,local_4e8,args_1,(bool *)local_478);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_560);
  return (Expression *)pCVar7;
}

Assistant:

AST::Expression& visit (AST::Constant& c) override
        {
            super::visit (c);

            if (requiresRemapping (c.getResultType()))
            {
                auto& remappedType = getRemappedType (c.context, c.getResultType());
                auto& args = allocator.allocate<AST::CommaSeparatedList> (c.context);
                auto resultType = c.getResultType();

                if (c.getResultType().isComplex32())
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex32();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }
                else
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex64();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }

                return allocator.allocate<AST::CallOrCast> (remappedType, args, false);
            }

            return c;
        }